

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

void google::protobuf::internal::ReflectionOps::DiscardUnknownFields(Message *message)

{
  FieldDescriptor *this;
  pointer ppFVar1;
  bool bVar2;
  int iVar3;
  Reflection *this_00;
  UnknownFieldSet *pUVar4;
  MapFieldBase *this_01;
  Descriptor *this_02;
  FieldDescriptor *pFVar5;
  Message *pMVar6;
  pointer ppFVar7;
  int index;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  
  this_00 = GetReflectionOrDie(message);
  pUVar4 = Reflection::GetUnknownFields(this_00,message);
  iVar3 = RepeatedField<google::protobuf::UnknownField>::size(&pUVar4->fields_);
  if (iVar3 != 0) {
    pUVar4 = Reflection::MutableUnknownFields(this_00,message);
    UnknownFieldSet::Clear(pUVar4);
  }
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(this_00,message,&fields);
  ppFVar1 = fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppFVar7 = fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppFVar7 == ppFVar1) {
      std::
      _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~_Vector_base(&fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     );
      return;
    }
    this = *ppFVar7;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type_ * 4) == 10) {
      bVar2 = FieldDescriptor::is_map(this);
      if (bVar2) {
        this_01 = Reflection::MutableMapData(this_00,message,this);
        if (this_01 != (MapFieldBase *)0x0) {
          bVar2 = MapFieldBase::IsMapValid(this_01);
          if (bVar2) {
            this_02 = FieldDescriptor::message_type(this);
            pFVar5 = Descriptor::field(this_02,1);
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar5->type_ * 4) == 10) {
              MapIterator::MapIterator(&iter,message,this);
              MapIterator::MapIterator(&end,message,this);
              MapFieldBase::MapBegin(this_01,&iter);
              MapFieldBase::MapEnd(this_01,&end);
              while( true ) {
                bVar2 = protobuf::operator!=(&iter,&end);
                if (!bVar2) break;
                MapFieldBase::SetMapDirty(iter.map_);
                pMVar6 = MapValueRef::MutableMessageValue(&iter.value_);
                Message::DiscardUnknownFields(pMVar6);
                MapIterator::operator++(&iter);
              }
            }
            goto LAB_00219de5;
          }
        }
      }
      bVar2 = FieldDescriptor::is_repeated(this);
      if (bVar2) {
        iVar3 = Reflection::FieldSize(this_00,message,this);
        index = 0;
        if (iVar3 < 1) {
          iVar3 = index;
        }
        for (; iVar3 != index; index = index + 1) {
          pMVar6 = Reflection::MutableRepeatedMessage(this_00,message,this,index);
          Message::DiscardUnknownFields(pMVar6);
        }
      }
      else {
        pMVar6 = Reflection::MutableMessage(this_00,message,this,(MessageFactory *)0x0);
        Message::DiscardUnknownFields(pMVar6);
      }
    }
LAB_00219de5:
    ppFVar7 = ppFVar7 + 1;
  } while( true );
}

Assistant:

void ReflectionOps::DiscardUnknownFields(Message* message) {
  const Reflection* reflection = GetReflectionOrDie(*message);

  if (reflection->GetUnknownFields(*message).field_count() != 0) {
    reflection->MutableUnknownFields(message)->Clear();
  }

  // Walk through the fields of this message and DiscardUnknownFields on any
  // messages present.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (const FieldDescriptor* field : fields) {
    // Skip over non-message fields.
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
      continue;
    }
    // Discard the unknown fields in maps that contain message values.
    const MapFieldBase* map_field =
        field->is_map() ? reflection->MutableMapData(message, field) : nullptr;
    if (map_field != nullptr && map_field->IsMapValid()) {
      if (IsMapValueMessageTyped(field)) {
        MapIterator iter(message, field);
        MapIterator end(message, field);
        for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
             ++iter) {
          iter.MutableValueRef()->MutableMessageValue()->DiscardUnknownFields();
        }
      }
      // Discard every unknown field inside messages in a repeated field.
    } else if (field->is_repeated()) {
      int size = reflection->FieldSize(*message, field);
      for (int j = 0; j < size; j++) {
        reflection->MutableRepeatedMessage(message, field, j)
            ->DiscardUnknownFields();
      }
      // Discard the unknown fields inside an optional message.
    } else {
      reflection->MutableMessage(message, field)->DiscardUnknownFields();
    }
  }
}